

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O2

qsizetype __thiscall QTextBoundaryFinder::toPreviousBoundary(QTextBoundaryFinder *this)

{
  QCharAttributes *pQVar1;
  long lVar2;
  qsizetype qVar3;
  
  pQVar1 = this->attributes;
  if (((pQVar1 == (QCharAttributes *)0x0) || (lVar2 = this->pos, lVar2 < 1)) ||
     ((this->sv).m_size < lVar2)) {
    this->pos = -1;
    qVar3 = -1;
  }
  else {
    qVar3 = lVar2 + -1;
    this->pos = qVar3;
    switch(this->t) {
    case Grapheme:
      while ((0 < qVar3 && (((byte)pQVar1[qVar3] & 1) == 0))) {
        qVar3 = qVar3 + -1;
        this->pos = qVar3;
      }
      break;
    case Word:
      while ((0 < qVar3 && (((byte)pQVar1[qVar3] & 2) == 0))) {
        qVar3 = qVar3 + -1;
        this->pos = qVar3;
      }
      break;
    case Sentence:
      while ((0 < qVar3 && (((byte)pQVar1[qVar3] & 4) == 0))) {
        qVar3 = qVar3 + -1;
        this->pos = qVar3;
      }
      break;
    case Line:
      while ((0 < qVar3 && (((byte)pQVar1[qVar3] & 8) == 0))) {
        qVar3 = qVar3 + -1;
        this->pos = qVar3;
      }
    }
  }
  return qVar3;
}

Assistant:

qsizetype QTextBoundaryFinder::toPreviousBoundary()
{
    if (!attributes || pos <= 0 || pos > sv.size()) {
        pos = -1;
        return pos;
    }

    --pos;
    switch(t) {
    case Grapheme:
        while (pos > 0 && !attributes[pos].graphemeBoundary)
            --pos;
        break;
    case Word:
        while (pos > 0 && !attributes[pos].wordBreak)
            --pos;
        break;
    case Sentence:
        while (pos > 0 && !attributes[pos].sentenceBoundary)
            --pos;
        break;
    case Line:
        while (pos > 0 && !attributes[pos].lineBreak)
            --pos;
        break;
    }

    return pos;
}